

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

attribute_keys_map_t * tchecker::syncprod::system_t::known_attributes_abi_cxx11_(void)

{
  int iVar1;
  attribute_keys_map_t *paVar2;
  allocator<char> local_29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  if (known_attributes[abi:cxx11]()::known_attr_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    if (iVar1 != 0) {
      paVar2 = tchecker::system::system_t::known_attributes_abi_cxx11_();
      std::
      array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_8UL>
      ::array(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_,paVar2);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"committed",&local_29);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 4),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"labels",&local_29);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)(known_attributes[abi:cxx11]()::known_attr_abi_cxx11_._M_elems + 4),&local_28);
      std::__cxx11::string::~string((string *)&local_28);
      __cxa_atexit(std::
                   array<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_8UL>
                   ::~array,&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&known_attributes[abi:cxx11]()::known_attr_abi_cxx11_);
    }
  }
  return &known_attributes[abi:cxx11]()::known_attr_abi_cxx11_;
}

Assistant:

tchecker::system::attribute_keys_map_t const & system_t::known_attributes()
{
  static tchecker::system::attribute_keys_map_t const known_attr{[&]() {
    tchecker::system::attribute_keys_map_t attr(tchecker::system::system_t::known_attributes());
    attr[tchecker::system::ATTR_LOCATION].insert("committed");
    attr[tchecker::system::ATTR_LOCATION].insert("labels");
    return attr;
  }()};
  return known_attr;
}